

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

void flatcc_builder_flush_vtable_cache(flatcc_builder_t *B)

{
  if (B->ht_width != 0) {
    memset(B->buffers[5].iov_base,0,B->buffers[5].iov_len);
    B->vb_end = 0;
    B->vd_end = 0x10;
  }
  return;
}

Assistant:

void flatcc_builder_flush_vtable_cache(flatcc_builder_t *B)
{
    iovec_t *buf = B->buffers + flatcc_builder_alloc_ht;

    if (B->ht_width == 0) {
        return;
    }
    memset(buf->iov_base, 0, buf->iov_len);
    /* Reserve the null entry. */
    B->vd_end = sizeof(vtable_descriptor_t);
    B->vb_end = 0;
}